

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_RC4.hh
# Opt level: O2

void __thiscall Pl_RC4::~Pl_RC4(Pl_RC4 *this)

{
  ~Pl_RC4(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

~Pl_RC4() final = default;